

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppu_widget.cpp
# Opt level: O1

void __thiscall nesvis::PpuWidget::draw_sprites(PpuWidget *this)

{
  bool bVar1;
  PpuRegisters *pPVar2;
  Sprite SVar3;
  array<sf::Texture,_512UL> *paVar4;
  uint8_t index;
  uint uVar5;
  ulong uVar6;
  ImVec2 local_50;
  array<sf::Texture,_512UL> *local_48;
  PpuWidget *local_40;
  ulong local_38;
  
  pPVar2 = n_e_s::nes::Nes::ppu_registers(this->nes_);
  uVar5 = (pPVar2->ctrl).value_ & 8;
  ImGui::Text("%s: %i","Sprite pattern table: ",(ulong)(uVar5 >> 3));
  local_50.x = 0.0;
  local_50.y = 0.0;
  ImGui::PushStyleVar(0xe,&local_50);
  uVar6 = (ulong)(uVar5 << 5);
  paVar4 = &this->pattern_table_textures_;
  uVar5 = 0;
  local_48 = paVar4;
  local_40 = this;
  local_38 = uVar6;
  do {
    SVar3 = PpuHelper::get_sprite(this->ppu_helper_,(uint8_t)uVar5);
    if ((uVar5 & 7) != 0) {
      ImGui::SameLine(0.0,-1.0);
    }
    local_50.x = 16.0;
    local_50.y = 16.0;
    ImGui::Image((Texture *)(&paVar4->field_0x0 + (SVar3._2_4_ & 0xff | uVar6) * 0x28),
                 (Vector2f *)&local_50,(Color *)&sf::Color::White,(Color *)&sf::Color::Transparent);
    bVar1 = ImGui::IsItemHovered(0);
    if (bVar1) {
      ImGui::BeginTooltip();
      ImGui::Text("Index: %02hhX",(ulong)uVar5);
      ImGui::Text("x: %hhu",(ulong)(SVar3._0_4_ & 0xff));
      paVar4 = local_48;
      ImGui::Text("y: %hhu",(ulong)(SVar3._1_4_ & 0xff));
      uVar6 = local_38;
      this = local_40;
      ImGui::Text("Palette: %02hhX",(ulong)(SVar3._4_4_ & 0xff));
      ImGui::EndTooltip();
    }
    uVar5 = uVar5 + 1;
  } while (uVar5 != 0x40);
  ImGui::PopStyleVar(1);
  return;
}

Assistant:

void PpuWidget::draw_sprites() {
    const auto reg = nes_->ppu_registers();
    const int sprite_pattern_table = reg.ctrl.is_set(3u) ? 1 : 0;
    ImGui::Text("%s: %i", "Sprite pattern table: ", sprite_pattern_table);
    ImGui::PushStyleVar(ImGuiStyleVar_ItemSpacing, ImVec2(0, 0));
    for (uint8_t index = 0; index < 64; ++index) {
        const auto sprite = ppu_helper_->get_sprite(index);
        const int modified_tile_index =
                sprite.tile_index + kPatternTableSize * sprite_pattern_table;

        if (index % 8 != 0) {
            ImGui::SameLine();
        }
        ImGui::Image(pattern_table_textures_[modified_tile_index],
                {kSpriteSize, kSpriteSize});
        if (ImGui::IsItemHovered()) {
            ImGui::BeginTooltip();
            ImGui::Text("Index: %02hhX", index);
            ImGui::Text("x: %hhu", sprite.x);
            ImGui::Text("y: %hhu", sprite.y);
            ImGui::Text("Palette: %02hhX", sprite.palette);
            ImGui::EndTooltip();
        }
    }
    ImGui::PopStyleVar(1);
}